

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::lowerReinterpretInt64(I64ToI32Lowering *this,Unary *curr)

{
  Builder *this_00;
  Builder *this_01;
  undefined1 auVar1 [16];
  size_t sVar2;
  char *pcVar3;
  Index index;
  Call *append;
  Call *args;
  Block *expression;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_00;
  Name target_01;
  Const *local_d8;
  Expression *local_d0;
  undefined1 local_c8 [8];
  TempVar highBits;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_98;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_78;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_60;
  Call *local_48;
  Builder *local_40;
  allocator_type local_32;
  allocator_type local_31;
  
  fetchOutParam((TempVar *)local_c8,this,curr->value);
  pcVar3 = DAT_01174ec8;
  sVar2 = ABI::wasm2js::SCRATCH_STORE_I32;
  local_40 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_d8 = Builder::makeConst<int>(local_40,0);
  local_d0 = curr->value;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_d8;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_78,__l,
             &local_32);
  target.super_IString.str._M_str = pcVar3;
  target.super_IString.str._M_len = sVar2;
  local_48 = Builder::makeCall(local_40,target,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &local_78,(Type)0x0,false);
  pcVar3 = DAT_01174ec8;
  sVar2 = ABI::wasm2js::SCRATCH_STORE_I32;
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  highBits.ty.id = (uintptr_t)Builder::makeConst<int>(this_00,1);
  this_01 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  index = TempVar::operator_cast_to_unsigned_int((TempVar *)local_c8);
  Builder::makeLocalGet(this_01,index,(Type)0x2);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&highBits.ty;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_60,__l_00,
             &local_31);
  target_00.super_IString.str._M_str = pcVar3;
  target_00.super_IString.str._M_len = sVar2;
  append = Builder::makeCall(this_00,target_00,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &local_60,(Type)0x0,false);
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  target_01.super_IString.str._M_str = DAT_01174ef8;
  target_01.super_IString.str._M_len = ABI::wasm2js::SCRATCH_LOAD_F64;
  args = Builder::makeCall((this->builder)._M_t.
                           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                           .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,target_01,
                           (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &local_98,(Type)0x5,false);
  expression = Builder::blockify<wasm::Call*>
                         (local_40,(Expression *)local_48,(Expression *)append,args);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_98);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_60);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_78);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)expression);
  MemoryUtils::ensureExists
            ((this->
             super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
             ).
             super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             currModule);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = args;
  ABI::wasm2js::ensureHelpers
            ((wasm2js *)
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
             ).
             super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             currModule,(Module *)0x0,(IString)(auVar1 << 0x40));
  TempVar::~TempVar((TempVar *)local_c8);
  return;
}

Assistant:

void lowerReinterpretInt64(Unary* curr) {
    // Assume that the wasm file assumes the address 0 is invalid and roundtrip
    // our i64 through memory at address 0
    TempVar highBits = fetchOutParam(curr->value);
    Block* result = builder->blockify(
      builder->makeCall(ABI::wasm2js::SCRATCH_STORE_I32,
                        {builder->makeConst(int32_t(0)), curr->value},
                        Type::none),
      builder->makeCall(ABI::wasm2js::SCRATCH_STORE_I32,
                        {builder->makeConst(int32_t(1)),
                         builder->makeLocalGet(highBits, Type::i32)},
                        Type::none),
      builder->makeCall(ABI::wasm2js::SCRATCH_LOAD_F64, {}, Type::f64));
    replaceCurrent(result);
    MemoryUtils::ensureExists(getModule());
    ABI::wasm2js::ensureHelpers(getModule());
  }